

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O2

int __thiscall
ApprovalTests::Options::FileOptions::clone
          (FileOptions *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  string local_30;
  
  ::std::__cxx11::string::string((string *)&local_30,(string *)(__fn + 8));
  FileOptions(this,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return (int)this;
}

Assistant:

Options::FileOptions Options::FileOptions::clone() const
    {
        // the returned options_ must be null
        return FileOptions(fileExtensionWithDot_);
    }